

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int matchNonSingletonOutputs
              (Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
              Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
              Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
              Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
              Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
              Vec_Int_t *iNonSingleton,Abc_Ntk_t *subNtk1,Abc_Ntk_t *subNtk2,Vec_Ptr_t *oMatchPairs,
              Vec_Int_t *oNonSingleton,int oI,int idx,int ii,int iidx)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *mismatch;
  int *piVar7;
  void *__s;
  void **ppvVar8;
  Vec_Int_t *pVVar9;
  void *pvVar10;
  long lVar11;
  int *__ptr;
  int *__ptr_00;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  int iVar18;
  int iVar19;
  
  matchNonSingletonOutputs_MATCH_FOUND = 0;
  if (oNonSingleton->nSize == oI) {
    if ((iNonSingleton == (Vec_Int_t *)0x0) ||
       (iVar5 = match1by1(pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,
                          pNtk2,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                          matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,ii,iidx),
       iVar5 != 0)) {
      matchNonSingletonOutputs_MATCH_FOUND = 1;
      uVar13 = 1;
    }
    else {
      uVar13 = (uint)matchNonSingletonOutputs_MATCH_FOUND;
    }
    goto LAB_0029dc99;
  }
  if ((oI < 0) || (oNonSingleton->nSize <= oI)) {
LAB_0029dcae:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = oNonSingleton->pArray[(uint)oI];
  mismatch = (Vec_Int_t *)malloc(0x10);
  mismatch->nCap = 0x10;
  mismatch->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  mismatch->pArray = piVar7;
  pVVar9 = oMatch1[iVar5];
  iVar6 = pVVar9->nSize;
  sVar17 = (long)iVar6 * 4;
  __s = malloc(sVar17);
  if (0 < (long)iVar6) {
    memset(__s,0,sVar17);
  }
  if ((idx < 0) || (iVar6 <= idx)) goto LAB_0029dcae;
  uVar12 = (ulong)(uint)idx;
  iVar6 = pVVar9->pArray[uVar12];
  if (((long)iVar6 < 0) || (subNtk1->vPos->nSize <= iVar6)) {
LAB_0029dccd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar10 = subNtk1->vPos->pArray[iVar6];
  uVar13 = oMatchPairs->nSize;
  if (uVar13 == oMatchPairs->nCap) {
    if ((int)uVar13 < 0x10) {
      if (oMatchPairs->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(oMatchPairs->pArray,0x80);
      }
      oMatchPairs->pArray = ppvVar8;
      oMatchPairs->nCap = 0x10;
    }
    else {
      if (oMatchPairs->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar13 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar13 << 4);
      }
      oMatchPairs->pArray = ppvVar8;
      oMatchPairs->nCap = uVar13 * 2;
    }
  }
  else {
    ppvVar8 = oMatchPairs->pArray;
  }
  iVar6 = oMatchPairs->nSize;
  oMatchPairs->nSize = iVar6 + 1;
  ppvVar8[iVar6] = pvVar10;
  if (oMatch1[iVar5]->nSize <= idx) goto LAB_0029dcae;
  Vec_IntPush(matchedOutputs1,oMatch1[iVar5]->pArray[uVar12]);
  pVVar9 = oMatch2[iVar5];
  if (pVVar9->nSize < 1 || (matchNonSingletonOutputs_MATCH_FOUND & 1) != 0) {
    if ((matchNonSingletonOutputs_MATCH_FOUND & 1) == 0) goto LAB_0029dc5c;
LAB_0029d6b3:
    uVar13 = 1;
    if (matchNonSingletonOutputs::counter != 0) {
      matchNonSingletonOutputs::counter = 0;
    }
  }
  else {
    lVar16 = 0;
    do {
      uVar13 = pVVar9->pArray[lVar16];
      if (((ulong)uVar13 != 0xffffffff) && (*(int *)((long)__s + lVar16 * 4) != 1)) {
        if (((int)uVar13 < 0) || (subNtk2->vPos->nSize <= (int)uVar13)) goto LAB_0029dccd;
        pvVar10 = subNtk2->vPos->pArray[uVar13];
        uVar13 = oMatchPairs->nSize;
        if (uVar13 == oMatchPairs->nCap) {
          if ((int)uVar13 < 0x10) {
            if (oMatchPairs->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(oMatchPairs->pArray,0x80);
            }
            oMatchPairs->pArray = ppvVar8;
            oMatchPairs->nCap = 0x10;
          }
          else {
            if (oMatchPairs->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar13 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar13 << 4);
            }
            oMatchPairs->pArray = ppvVar8;
            oMatchPairs->nCap = uVar13 * 2;
          }
        }
        else {
          ppvVar8 = oMatchPairs->pArray;
        }
        iVar6 = oMatchPairs->nSize;
        oMatchPairs->nSize = iVar6 + 1;
        ppvVar8[iVar6] = pvVar10;
        if (oMatch2[iVar5]->nSize <= lVar16) goto LAB_0029dcae;
        Vec_IntPush(matchedOutputs2,oMatch2[iVar5]->pArray[lVar16]);
        matchNonSingletonOutputs::counter = matchNonSingletonOutputs::counter + 1;
        iVar6 = Abc_NtkBmSat(subNtk1,subNtk2,(Vec_Ptr_t *)0x0,oMatchPairs,mismatch,0);
        if (iVar6 == 0) {
          pVVar2 = subNtk1->vPis;
          iVar6 = pVVar2->nSize;
          sVar17 = (size_t)iVar6;
          pvVar10 = malloc(sVar17 + 1);
          *(undefined1 *)((long)pvVar10 + sVar17) = 0;
          if (0 < (long)sVar17) {
            memset(pvVar10,0x30,sVar17);
          }
          iVar19 = mismatch->nSize;
          if (0 < (long)iVar19) {
            uVar14 = 1;
            do {
              if ((ulong)(long)iVar19 <= uVar14) goto LAB_0029dcae;
              *(char *)((long)pvVar10 + (long)mismatch->pArray[uVar14 - 1]) =
                   (char)mismatch->pArray[uVar14];
              iVar18 = (int)uVar14;
              uVar14 = uVar14 + 2;
            } while (iVar18 + 1 < iVar19);
          }
          piVar7 = (int *)malloc((long)subNtk1->vCis->nSize << 2);
          if (0 < iVar6) {
            lVar11 = 0;
            do {
              piVar7[lVar11] = *(char *)((long)pvVar10 + lVar11) + -0x30;
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar2->nSize);
          }
          pVVar3 = subNtk1->vBoxes;
          iVar6 = pVVar3->nSize;
          if (0 < iVar6) {
            ppvVar8 = pVVar3->pArray;
            lVar11 = 0;
            do {
              if ((*(uint *)((long)ppvVar8[lVar11] + 0x14) & 0xf) == 8) {
                piVar7[pVVar2->nSize + lVar11] = *(int *)((long)ppvVar8[lVar11] + 0x38) + -1;
                iVar6 = pVVar3->nSize;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar6);
          }
          __ptr = Abc_NtkVerifySimulatePattern(subNtk1,piVar7);
          pVVar2 = subNtk2->vBoxes;
          iVar6 = pVVar2->nSize;
          if (0 < iVar6) {
            ppvVar8 = pVVar2->pArray;
            lVar11 = 0;
            do {
              if ((*(uint *)((long)ppvVar8[lVar11] + 0x14) & 0xf) == 8) {
                piVar7[subNtk2->vPis->nSize + lVar11] = *(int *)((long)ppvVar8[lVar11] + 0x38) + -1;
                iVar6 = pVVar2->nSize;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar6);
          }
          __ptr_00 = Abc_NtkVerifySimulatePattern(subNtk2,piVar7);
          pVVar9 = oMatch1[iVar5];
          uVar13 = pVVar9->nSize;
          if (0 < (int)uVar13) {
            if ((int)uVar13 <= idx) goto LAB_0029dcae;
            pVVar4 = oMatch2[iVar5];
            uVar1 = pVVar4->nSize;
            uVar14 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar14 = 0;
            }
            uVar15 = 0;
            do {
              if (uVar14 == uVar15) goto LAB_0029dcae;
              if (__ptr[pVVar9->pArray[uVar12]] != __ptr_00[pVVar4->pArray[uVar15]]) {
                *(undefined4 *)((long)__s + uVar15 * 4) = 1;
              }
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
          if (pvVar10 != (void *)0x0) {
            free(pvVar10);
          }
          if (piVar7 != (int *)0x0) {
            free(piVar7);
          }
          if (__ptr != (int *)0x0) {
            free(__ptr);
          }
          if (__ptr_00 != (int *)0x0) {
            free(__ptr_00);
          }
        }
        else {
          if (oMatch2[iVar5]->nSize <= lVar16) goto LAB_0029dcae;
          piVar7 = oMatch2[iVar5]->pArray;
          iVar6 = piVar7[lVar16];
          piVar7[lVar16] = -1;
          iVar19 = idx + 1;
          iVar18 = oI;
          if (oMatch1[iVar5]->nSize + -1 == idx) {
            iVar19 = 0;
            iVar18 = oI + 1;
          }
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,iGroup1,oMatch1,oGroup1,pNtk2,
                     nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,subNtk1,subNtk2,
                     oMatchPairs,oNonSingleton,iVar18,iVar19,ii,iidx);
          if (oMatch2[iVar5]->nSize <= lVar16) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          oMatch2[iVar5]->pArray[lVar16] = iVar6;
        }
        if (matchNonSingletonOutputs_MATCH_FOUND != 0) goto LAB_0029d6b3;
        if (oMatchPairs->nSize < 1) goto LAB_0029dd0b;
        oMatchPairs->nSize = oMatchPairs->nSize + -1;
        if (matchedOutputs2->nSize < 1) goto LAB_0029dcec;
        matchedOutputs2->nSize = matchedOutputs2->nSize + -1;
      }
      lVar16 = lVar16 + 1;
      pVVar9 = oMatch2[iVar5];
    } while (lVar16 < pVVar9->nSize);
LAB_0029dc5c:
    if (oMatchPairs->nSize < 1) {
LAB_0029dd0b:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    oMatchPairs->nSize = oMatchPairs->nSize + -1;
    if (matchedOutputs1->nSize < 1) {
LAB_0029dcec:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    matchedOutputs1->nSize = matchedOutputs1->nSize + -1;
    uVar13 = 0;
  }
  free(mismatch);
  if (__s != (void *)0x0) {
    free(__s);
  }
LAB_0029dc99:
  return uVar13 & 1;
}

Assistant:

int matchNonSingletonOutputs(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
                              Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
                              Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton,                         
                              Abc_Ntk_t * subNtk1, Abc_Ntk_t * subNtk2, Vec_Ptr_t * oMatchPairs,
                              Vec_Int_t * oNonSingleton, int oI, int idx, int ii, int iidx)
{        
    static int MATCH_FOUND;
    int i;
    int j, temp;
    Vec_Int_t * mismatch;        
    int * skipList;    
    static int counter = 0;

    MATCH_FOUND = FALSE;
    
    if( oI == Vec_IntSize( oNonSingleton ) )
    {
        if( iNonSingleton != NULL)            
            if( match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                          pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii, iidx) )
                MATCH_FOUND = TRUE;    

        if( iNonSingleton == NULL)
            MATCH_FOUND = TRUE;

        return MATCH_FOUND;
    }

    i = Vec_IntEntry(oNonSingleton, oI);

    mismatch = Vec_IntAlloc(10);
    
    skipList = ABC_ALLOC(int, Vec_IntSize(oMatch1[i]));

    for(j = 0; j < Vec_IntSize(oMatch1[i]); j++)
        skipList[j] = FALSE;

    Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(oMatch1[i], idx)) );
    Vec_IntPush(matchedOutputs1, Vec_IntEntry(oMatch1[i], idx));

    for(j = 0; j < Vec_IntSize( oMatch2[i] ) && MATCH_FOUND == FALSE; j++)
    {
        if( Vec_IntEntry(oMatch2[i], j) == -1 || skipList[j] == TRUE)
            continue;

        Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(oMatch2[i], j)));
        Vec_IntPush(matchedOutputs2, Vec_IntEntry(oMatch2[i], j));

        counter++;        
        if( Abc_NtkBmSat( subNtk1, subNtk2, NULL, oMatchPairs, mismatch, 0) )
        {
            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(oMatch1[i], idx))), 
                                         Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(oMatch2[i], j))));            */

            temp =  Vec_IntEntry(oMatch2[i], j);
            Vec_IntWriteEntry(oMatch2[i], j, -1);
            
            if(idx != Vec_IntSize( oMatch1[i] ) - 1)
                // call the same function with idx+1
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI, idx+1, ii, iidx);
            else    
                // call the same function with idx = 0 and oI++
                matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                         subNtk1, subNtk2, oMatchPairs,
                                         oNonSingleton, oI+1, 0, ii, iidx);

            Vec_IntWriteEntry(oMatch2[i], j, temp);
        }        
        else
        {
            int * output1, * output2;
            int k;
            Abc_Obj_t * pObj;
            int * pModel;
            char * vPiValues;            
            

            vPiValues = ABC_ALLOC( char,  Abc_NtkPiNum(subNtk1) + 1);
            vPiValues[Abc_NtkPiNum(subNtk1)] = '\0';    
            
            for(k = 0; k < Abc_NtkPiNum(subNtk1); k++)
                vPiValues[k] = '0';

            for(k = 0; k < Vec_IntSize(mismatch); k += 2)            
                vPiValues[Vec_IntEntry(mismatch, k)] = Vec_IntEntry(mismatch, k+1);                        

            pModel = ABC_ALLOC( int, Abc_NtkCiNum(subNtk1) );    

            Abc_NtkForEachPi( subNtk1, pObj, k )
                pModel[k] = vPiValues[k] - '0';
            Abc_NtkForEachLatch( subNtk1, pObj, k )
                pModel[Abc_NtkPiNum(subNtk1)+k] = pObj->iData - 1;            
    
            output1 = Abc_NtkVerifySimulatePattern( subNtk1, pModel );

            Abc_NtkForEachLatch( subNtk2, pObj, k )
                pModel[Abc_NtkPiNum(subNtk2)+k] = pObj->iData - 1;

            output2 = Abc_NtkVerifySimulatePattern( subNtk2, pModel );
            

            for(k = 0; k < Vec_IntSize( oMatch1[i] ); k++)
                if(output1[Vec_IntEntry(oMatch1[i], idx)] != output2[Vec_IntEntry(oMatch2[i], k)])
                {
                    skipList[k] = TRUE;    
                    /*printf("Output is SKIPPED");*/
                }
                
            ABC_FREE( vPiValues );
            ABC_FREE( pModel );
            ABC_FREE( output1 );
            ABC_FREE( output2 );
        }
        
        if(MATCH_FOUND == FALSE )
        {
            Vec_PtrPop(oMatchPairs);
            Vec_IntPop(matchedOutputs2);
        }
    }

    if(MATCH_FOUND == FALSE )
    {
        Vec_PtrPop(oMatchPairs);
        Vec_IntPop(matchedOutputs1);
    }

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of OUTPUT SAT instances = %d", counter);*/
        counter = 0;
    }

    ABC_FREE( mismatch );
    ABC_FREE( skipList );

    return MATCH_FOUND;
}